

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

Iterator __thiscall
HashMap<Socket_*,_unsigned_int>::insert
          (HashMap<Socket_*,_unsigned_int> *this,Iterator *position,Socket **key,uint *value)

{
  Socket *pSVar1;
  Item *pIVar2;
  Item **ppIVar3;
  ItemBlock *pIVar4;
  long lVar5;
  Item *pIVar6;
  ulong uVar7;
  Item *pIVar8;
  Iterator *pIVar9;
  ulong uVar10;
  
  ppIVar3 = this->data;
  if (ppIVar3 != (Item **)0x0) {
    for (pIVar6 = ppIVar3[((ulong)*key >> 3) % this->capacity]; pIVar6 != (Item *)0x0;
        pIVar6 = pIVar6->nextCell) {
      if (pIVar6->key == *key) goto LAB_00109360;
    }
  }
  pIVar6 = (this->_end).item;
LAB_00109360:
  if (pIVar6 == (this->_end).item) {
    if (ppIVar3 == (Item **)0x0) {
      uVar10 = this->capacity << 3;
      ppIVar3 = (Item **)operator_new__(uVar10);
      this->data = ppIVar3;
      Memory::zero(ppIVar3,uVar10);
    }
    pIVar6 = this->freeItem;
    if (pIVar6 == (Item *)0x0) {
      pIVar4 = (ItemBlock *)operator_new__(200);
      pIVar4->next = this->blocks;
      this->blocks = pIVar4;
      pIVar6 = this->freeItem;
      lVar5 = 0x38;
      uVar10 = 8;
      do {
        uVar7 = uVar10;
        *(Item **)((long)&pIVar4[4].next + lVar5) = pIVar6;
        pIVar6 = (Item *)((long)&pIVar4->next + lVar5);
        lVar5 = lVar5 + 0x30;
        uVar10 = uVar7 + 0x30;
      } while (uVar10 < 0x98);
      pIVar6 = (Item *)(pIVar4 + 1);
      pIVar8 = (Item *)((long)&pIVar4[6].next + uVar7);
    }
    else {
      pIVar8 = pIVar6->prev;
    }
    this->freeItem = pIVar8;
    pSVar1 = *key;
    pIVar6->key = pSVar1;
    pIVar6->value = *value;
    ppIVar3 = this->data + ((ulong)pSVar1 >> 3) % this->capacity;
    pIVar6->cell = ppIVar3;
    pIVar8 = *ppIVar3;
    pIVar6->nextCell = pIVar8;
    if (pIVar8 != (Item *)0x0) {
      pIVar8->cell = &pIVar6->nextCell;
    }
    *ppIVar3 = pIVar6;
    pIVar8 = position->item;
    pIVar2 = pIVar8->prev;
    pIVar6->prev = pIVar2;
    if (pIVar2 == (Item *)0x0) {
      pIVar9 = &this->_begin;
    }
    else {
      pIVar9 = (Iterator *)&pIVar8->prev->next;
    }
    pIVar9->item = pIVar6;
    pIVar6->next = pIVar8;
    pIVar8->prev = pIVar6;
    this->_size = this->_size + 1;
  }
  else {
    pIVar6->value = *value;
  }
  return (Iterator)pIVar6;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Iterator it = find(key);
    if(it != _end)
    {
      *it = value;
      return it;
    }

    if(!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*) * capacity);
    }
    
    Item* item;
    if(freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for(Item* i = item + 1, * end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item) Item(key, value) == item);
#else
    new(item) Item(key, value);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;
    
    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }